

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateSlice(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Range)

{
  int i;
  int iVar1;
  char *format;
  
  if (0 < iFon) {
    format = Cba_ManGetSliceName(p,iFon,Range);
    i = Cba_NtkNewStrId(p,format);
    iVar1 = Cba_NtkGetMap(p,i);
    if (iVar1 == 0) {
      iVar1 = Cba_ObjAlloc(p,CBA_BOX_SLICE,1,1);
      Cba_ObjSetName(p,iVar1,i);
      Cba_ObjSetFinFon(p,iVar1,0,iFon);
      iVar1 = Cba_ObjFon0(p,iVar1);
      Cba_FonSetRange(p,iVar1,Range);
      Cba_FonSetName(p,iVar1,i);
      Cba_NtkSetMap(p,i,iVar1);
    }
    return iVar1;
  }
  __assert_fail("Cba_FonIsReal(iFon)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x596,"int Prs_CreateSlice(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
}

Assistant:

int Prs_CreateSlice( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Range )
{
    int iObj, iFonNew, NameId;
    assert( Cba_FonIsReal(iFon) );
    // check existing slice
    NameId = Cba_NtkNewStrId( p, Cba_ManGetSliceName(p, iFon, Range) );
    iFonNew = Cba_NtkGetMap( p, NameId );
    if ( iFonNew )
        return iFonNew;
    // create slice
    iObj = Cba_ObjAlloc( p, CBA_BOX_SLICE, 1, 1 );
    Cba_ObjSetName( p, iObj, NameId );
    Cba_ObjSetFinFon( p, iObj, 0, iFon );
    iFonNew = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFonNew, Range );
    Cba_FonSetName( p, iFonNew, NameId );
    Cba_NtkSetMap( p, NameId, iFonNew );
    return iFonNew;        
}